

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O0

void __thiscall M_tree::delete_n(M_tree *this,Node *node)

{
  Node *node_local;
  M_tree *this_local;
  
  if (node != (Node *)0x0) {
    if (node->right != (Node *)0x0) {
      delete_n(this,node->right);
    }
    if (node->left != (Node *)0x0) {
      delete_n(this,node->left);
    }
    if (node != (Node *)0x0) {
      Node::~Node(node);
      operator_delete(node,0x50);
    }
  }
  return;
}

Assistant:

void M_tree::delete_n(Node *node) {
    if(node == NULL){
        return;
    }
    if(node->right != NULL){
        delete_n(node->right);
    }

    if(node->left != NULL){
        delete_n(node->left);
    }
    delete(node);
}